

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseDocument(TidyDocImpl *doc)

{
  NodeType NVar1;
  TidyTagId TVar2;
  ulong uVar3;
  TidyDocImpl *node;
  Dict *pDVar4;
  Node *pNVar5;
  Bool BVar6;
  int iVar7;
  uint uVar8;
  Node *pNVar9;
  AttVal *pAVar10;
  Node *pNVar11;
  Stack *stack;
  TidyDocImpl *node_00;
  Node *pNVar12;
  Node **ppNVar13;
  Node **ppNVar14;
  
  pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
  if (pNVar9 != (Node *)0x0) {
    ppNVar14 = &(doc->root).content;
    pNVar11 = (Node *)0x0;
LAB_0013e205:
    do {
      pNVar12 = pNVar9;
      if (pNVar12->type == XmlDecl) {
        doc->xmlDetected = yes;
        pNVar9 = prvTidyFindXmlDecl(doc);
        if ((pNVar9 == (Node *)0x0) || (*ppNVar14 == (Node *)0x0)) {
          if ((1 < pNVar12->line) || (pNVar12->column != 1)) {
            prvTidyReport(doc,&doc->root,pNVar12,0x275);
          }
          goto LAB_0013e24c;
        }
LAB_0013e264:
        prvTidyReport(doc,&doc->root,pNVar12,0x235);
        prvTidyFreeNode(doc,pNVar12);
      }
      else {
LAB_0013e24c:
        BVar6 = InsertMisc(&doc->root,pNVar12);
        if (BVar6 == no) {
          NVar1 = pNVar12->type;
          if (NVar1 == EndTag) goto LAB_0013e264;
          if (NVar1 == StartTag) {
            if (pNVar12->tag == (Dict *)0x0) goto LAB_0013e3d0;
            if ((((pNVar12->tag->id == TidyTag_HTML) &&
                 (pAVar10 = prvTidyAttrGetById(pNVar12,TidyAttr_XMLNS), pAVar10 != (AttVal *)0x0))
                && (pAVar10->value != (ctmbstr)0x0)) &&
               (iVar7 = prvTidytmbstrcasecmp(pAVar10->value,"http://www.w3.org/1999/xhtml"),
               iVar7 == 0)) {
              iVar7 = *(int *)((doc->config).value + 0x21);
              doc->lexer->isvoyager = yes;
              BVar6 = (Bool)(iVar7 == 0);
              prvTidySetOptionBool(doc,TidyXhtmlOut,BVar6);
              prvTidySetOptionBool(doc,TidyXmlOut,BVar6);
              if (iVar7 == 0) {
                prvTidySetOptionBool(doc,TidyUpperCaseTags,no);
                prvTidySetOptionInt(doc,TidyUpperCaseAttrs,0);
              }
            }
            if (((pNVar12->type != StartTag) || (pNVar12->tag == (Dict *)0x0)) ||
               (pNVar12->tag->id != TidyTag_HTML)) goto LAB_0013e3d0;
          }
          else {
            if (NVar1 == DocTypeTag) {
              if (pNVar11 == (Node *)0x0) {
                pNVar12->parent = &doc->root;
                if (doc == (TidyDocImpl *)0x0) {
                  pNVar12->prev = (Node *)0x0;
                }
                else {
                  pNVar9 = (doc->root).last;
                  pNVar12->prev = pNVar9;
                  ppNVar13 = &pNVar9->next;
                  if (pNVar9 == (Node *)0x0) {
                    ppNVar13 = ppNVar14;
                  }
                  *ppNVar13 = pNVar12;
                  (doc->root).last = pNVar12;
                }
              }
              else {
                prvTidyReport(doc,&doc->root,pNVar12,0x235);
                prvTidyFreeNode(doc,pNVar12);
                pNVar12 = pNVar11;
              }
              pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
              pNVar11 = pNVar12;
              if (pNVar9 == (Node *)0x0) break;
              goto LAB_0013e205;
            }
LAB_0013e3d0:
            prvTidyUngetToken(doc);
            pNVar12 = prvTidyInferredTag(doc,TidyTag_HTML);
          }
          pNVar9 = prvTidyFindDocType(doc);
          if (pNVar9 == (Node *)0x0) {
            uVar3 = (doc->config).value[0xe].v;
            if (uVar3 == 1) {
LAB_0013e439:
              prvTidyAdjustTags(doc);
            }
            else {
              if (*(int *)((doc->config).value + 6) != 1) {
                prvTidyReport(doc,(Node *)0x0,(Node *)0x0,600);
              }
              if ((uVar3 & 0xfffffffffffffffd) != 0) goto LAB_0013e439;
            }
            pNVar12->parent = &doc->root;
LAB_0013e444:
            pNVar9 = (doc->root).last;
            pNVar12->prev = pNVar9;
            ppNVar13 = &pNVar9->next;
            if (pNVar9 == (Node *)0x0) {
              ppNVar13 = ppNVar14;
            }
            *ppNVar13 = pNVar12;
            (doc->root).last = pNVar12;
          }
          else {
            pNVar12->parent = &doc->root;
            if (doc != (TidyDocImpl *)0x0) goto LAB_0013e444;
            pNVar12->prev = (Node *)0x0;
          }
          ParseHTMLWithNode(doc,pNVar12);
          break;
        }
      }
      pNVar9 = prvTidyGetToken(doc,IgnoreWhitespace);
    } while (pNVar9 != (Node *)0x0);
  }
  if ((doc->config).value[1].v != 0) {
    prvTidyAccessibilityChecks(doc);
  }
  pNVar9 = prvTidyFindHTML(doc);
  if (pNVar9 == (Node *)0x0) {
    pNVar11 = prvTidyInferredTag(doc,TidyTag_HTML);
    pNVar11->parent = &doc->root;
    pNVar9 = (doc->root).last;
    pNVar11->prev = pNVar9;
    ppNVar14 = &pNVar9->next;
    if (pNVar9 == (Node *)0x0) {
      ppNVar14 = &(doc->root).content;
    }
    *ppNVar14 = pNVar11;
    (doc->root).last = pNVar11;
    ParseHTMLWithNode(doc,pNVar11);
  }
  pNVar9 = prvTidyFindTITLE(doc);
  if (pNVar9 == (Node *)0x0) {
    pNVar9 = prvTidyFindHEAD(doc);
    if (*(int *)((doc->config).value + 6) != 1) {
      prvTidyReport(doc,pNVar9,(Node *)0x0,0x262);
    }
    pNVar11 = prvTidyInferredTag(doc,TidyTag_TITLE);
    pNVar11->parent = pNVar9;
    if (pNVar9 == (Node *)0x0) {
      pNVar11->prev = (Node *)0x0;
    }
    else {
      pNVar12 = pNVar9->last;
      pNVar11->prev = pNVar12;
      ppNVar14 = &pNVar9->content;
      if (pNVar12 != (Node *)0x0) {
        ppNVar14 = &pNVar12->next;
      }
      *ppNVar14 = pNVar11;
      pNVar9->last = pNVar11;
    }
  }
  else if (((pNVar9->content == (Node *)0x0) && (*(int *)((doc->config).value + 6) != 1)) &&
          (BVar6 = prvTidyIsHTML5Mode(doc), BVar6 != no)) {
    prvTidyReport(doc,pNVar9,(Node *)0x0,0x293);
  }
  AttributeChecks(doc,&doc->root);
  ReplaceObsoleteElements(doc,&doc->root);
  prvTidyDropEmptyElements(doc,&doc->root);
  stack = prvTidynewStack(doc,0x10);
  node_00 = doc;
  do {
    node = (TidyDocImpl *)(node_00->root).next;
    BVar6 = prvTidynodeIsText(&node_00->root);
    if (((BVar6 != no) && (BVar6 = prvTidynodeIsText(&node_00->root), BVar6 != no)) &&
       (pNVar9 = (node_00->root).parent, pNVar11 = pNVar9, pNVar9->type != DocTypeTag)) {
      do {
        if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->parser == prvTidyParsePre))
        goto LAB_0013e5d9;
        ppNVar14 = &pNVar11->parent;
        pNVar11 = *ppNVar14;
      } while (*ppNVar14 != (Node *)0x0);
      if ((pNVar9->tag == (Dict *)0x0) || (pNVar9->tag->parser != prvTidyParseScript)) {
        pNVar11 = (node_00->root).prev;
        if (pNVar11 == (Node *)0x0) {
          BVar6 = prvTidynodeHasCM(pNVar9,0x10);
          if (BVar6 != no) {
            pNVar11 = (node_00->root).prev;
            if (pNVar11 != (Node *)0x0) goto LAB_0013e7ed;
LAB_0013e80b:
            pNVar9 = (node_00->root).parent;
            if ((pNVar9->prev != (Node *)0x0) ||
               (BVar6 = prvTidynodeHasCM(pNVar9->parent,0x10), BVar6 != no)) goto LAB_0013e5d9;
          }
        }
        else if ((pNVar11->tag == (Dict *)0x0) ||
                ((TVar2 = pNVar11->tag->id, TVar2 != TidyTag_BR &&
                 ((((TVar2 != TidyTag_SCRIPT || (pNVar11->parent == (Node *)0x0)) ||
                   (pDVar4 = pNVar11->parent->tag, pDVar4 == (Dict *)0x0)) ||
                  (pDVar4->id != TidyTag_BODY)))))) {
LAB_0013e7ed:
          BVar6 = prvTidynodeHasCM(pNVar11,0x10);
          if ((BVar6 != no) || (BVar6 = prvTidynodeIsElement((node_00->root).prev), BVar6 == no)) {
            if ((node_00->root).prev == (Node *)0x0) goto LAB_0013e80b;
            goto LAB_0013e5d9;
          }
        }
        uVar8 = (node_00->root).start;
        while ((uVar8 < (node_00->root).end &&
               (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar8]), BVar6 != no))) {
          uVar8 = (node_00->root).start + 1;
          (node_00->root).start = uVar8;
        }
      }
    }
LAB_0013e5d9:
    BVar6 = prvTidynodeIsText(&node_00->root);
    if (((BVar6 != no) && (BVar6 = prvTidynodeIsText(&node_00->root), BVar6 != no)) &&
       (pNVar9 = (node_00->root).parent, pNVar11 = pNVar9, pNVar9->type != DocTypeTag)) {
      do {
        if ((pNVar11->tag != (Dict *)0x0) && (pNVar11->tag->parser == prvTidyParsePre))
        goto LAB_0013e5ff;
        ppNVar14 = &pNVar11->parent;
        pNVar11 = *ppNVar14;
      } while (*ppNVar14 != (Node *)0x0);
      if ((pNVar9->tag == (Dict *)0x0) || (pNVar9->tag->parser != prvTidyParseScript)) {
        pNVar11 = (node_00->root).next;
        if (pNVar11 == (Node *)0x0) {
          BVar6 = prvTidynodeHasCM(pNVar9,0x10);
          if ((BVar6 == no) ||
             ((pNVar9 = ((node_00->root).parent)->next, pNVar9 != (Node *)0x0 &&
              (BVar6 = prvTidynodeHasCM(pNVar9,0x10), BVar6 == no)))) goto LAB_0013e862;
        }
        else if (((pNVar11->tag != (Dict *)0x0) &&
                 ((TVar2 = pNVar11->tag->id, TVar2 == TidyTag_BR ||
                  ((((TVar2 == TidyTag_SCRIPT && (pNVar11->parent != (Node *)0x0)) &&
                    (pDVar4 = pNVar11->parent->tag, pDVar4 != (Dict *)0x0)) &&
                   (pDVar4->id == TidyTag_BODY)))))) ||
                ((BVar6 = prvTidynodeHasCM(pNVar11,0x10), BVar6 == no &&
                 (((pNVar11->type | CommentTag) == StartEndTag ||
                  (((BVar6 = prvTidynodeIsText(pNVar11), BVar6 != no &&
                    (pNVar11->start < pNVar11->end)) &&
                   (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[pNVar11->start]), BVar6 != no))))
                 )))) {
LAB_0013e862:
          uVar8 = (node_00->root).end;
          while (((node_00->root).start < uVar8 &&
                 (BVar6 = prvTidyIsWhite((int)doc->lexer->lexbuf[uVar8 - 1]), BVar6 != no))) {
            uVar8 = (node_00->root).end - 1;
            (node_00->root).end = uVar8;
          }
        }
      }
    }
LAB_0013e5ff:
    BVar6 = prvTidynodeIsText(&node_00->root);
    if ((BVar6 == no) || ((node_00->root).start < (node_00->root).end)) {
      if ((node_00->root).content == (Node *)0x0) goto LAB_0013e644;
      prvTidypush(stack,(Node *)node);
      node_00 = (TidyDocImpl *)(node_00->root).content;
    }
    else {
      prvTidyRemoveNode(&node_00->root);
      prvTidyFreeNode(doc,&node_00->root);
LAB_0013e644:
      node_00 = node;
      if (node == (TidyDocImpl *)0x0) {
        node_00 = (TidyDocImpl *)prvTidypop(stack);
      }
    }
    if (node_00 == (TidyDocImpl *)0x0) {
      prvTidyfreeStack(stack);
      if ((*(int *)((doc->config).value + 0x17) != 0) &&
         (pNVar9 = prvTidyFindBody(doc), pNVar9 != (Node *)0x0)) {
        pNVar9 = pNVar9->content;
        while (pNVar9 != (Node *)0x0) {
          BVar6 = prvTidynodeIsText(pNVar9);
          if (((BVar6 == no) || (BVar6 = prvTidyIsBlank(doc->lexer,pNVar9), BVar6 != no)) &&
             ((BVar6 = prvTidynodeIsElement(pNVar9), BVar6 == no ||
              (BVar6 = nodeCMIsOnlyInline(pNVar9), BVar6 == no)))) {
            pNVar9 = pNVar9->next;
          }
          else {
            pNVar12 = prvTidyInferredTag(doc,TidyTag_P);
            pNVar11 = pNVar9->parent;
            pNVar12->parent = pNVar11;
            pNVar12->next = pNVar9;
            pNVar12->prev = pNVar9->prev;
            pNVar9->prev = pNVar12;
            if (pNVar12->prev != (Node *)0x0) {
              pNVar12->prev->next = pNVar12;
            }
            if ((pNVar11 != (Node *)0x0) && (pNVar11->content == pNVar9)) {
              pNVar11->content = pNVar12;
            }
            do {
              BVar6 = prvTidynodeIsElement(pNVar9);
              if ((BVar6 != no) && (BVar6 = nodeCMIsOnlyInline(pNVar9), BVar6 == no))
              goto LAB_0013e9ea;
              pNVar11 = pNVar9->next;
              prvTidyRemoveNode(pNVar9);
              pNVar9->parent = pNVar12;
              pNVar5 = pNVar12->last;
              pNVar9->prev = pNVar5;
              ppNVar14 = &pNVar5->next;
              if (pNVar5 == (Node *)0x0) {
                ppNVar14 = &pNVar12->content;
              }
              *ppNVar14 = pNVar9;
              pNVar12->last = pNVar9;
              pNVar9 = pNVar11;
            } while (pNVar11 != (Node *)0x0);
            pNVar9 = (Node *)0x0;
LAB_0013e9ea:
            TrimSpaces(doc,pNVar12);
          }
        }
      }
      if (*(int *)((doc->config).value + 0x16) == 0) {
        return;
      }
      EncloseBlockText(doc,&doc->root);
      return;
    }
  } while( true );
}

Assistant:

void TY_(ParseDocument)(TidyDocImpl* doc)
{
    Node *node, *html, *doctype = NULL;

    while ((node = TY_(GetToken)(doc, IgnoreWhitespace)) != NULL)
    {
        if (node->type == XmlDecl)
        {
            doc->xmlDetected = yes;

            if (TY_(FindXmlDecl)(doc) && doc->root.content)
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)(doc, node);
                continue;
            }
            if (node->line > 1 || node->column != 1)
            {
                TY_(Report)(doc, &doc->root, node, SPACE_PRECEDING_XMLDECL);
            }
        }

        /* deal with comments etc. */
        if (InsertMisc( &doc->root, node ))
            continue;

        if (node->type == DocTypeTag)
        {
            if (doctype == NULL)
            {
                TY_(InsertNodeAtEnd)( &doc->root, node);
                doctype = node;
            }
            else
            {
                TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            }
            continue;
        }

        if (node->type == EndTag)
        {
            TY_(Report)(doc, &doc->root, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        if (node->type == StartTag && nodeIsHTML(node))
        {
            AttVal *xmlns = TY_(AttrGetById)(node, TidyAttr_XMLNS);

            if (AttrValueIs(xmlns, XHTML_NAMESPACE))
            {
                Bool htmlOut = cfgBool( doc, TidyHtmlOut );
                doc->lexer->isvoyager = yes;                  /* Unless plain HTML */
                TY_(SetOptionBool)( doc, TidyXhtmlOut, !htmlOut ); /* is specified, output*/
                TY_(SetOptionBool)( doc, TidyXmlOut, !htmlOut );   /* will be XHTML. */

                /* adjust other config options, just as in config.c */
                if ( !htmlOut )
                {
                    TY_(SetOptionBool)( doc, TidyUpperCaseTags, no );
                    TY_(SetOptionInt)( doc, TidyUpperCaseAttrs, no );
                }
            }
        }

        if ( node->type != StartTag || !nodeIsHTML(node) )
        {
            TY_(UngetToken)( doc );
            html = TY_(InferredTag)(doc, TidyTag_HTML);
        }
        else
            html = node;

        /*\
         *  #72, avoid MISSING_DOCTYPE if show-body-only.
         *  #191, also if --doctype omit, that is TidyDoctypeOmit
         *  #342, adjust tags to html4-- if not 'auto' or 'html5'
        \*/
        if (!TY_(FindDocType)(doc))
        {
            ulong dtmode = cfg( doc, TidyDoctypeMode );
            if ((dtmode != TidyDoctypeOmit) && !showingBodyOnly(doc))
                TY_(Report)(doc, NULL, NULL, MISSING_DOCTYPE);
            if ((dtmode != TidyDoctypeAuto) && (dtmode != TidyDoctypeHtml5))
            {
                /*\
                 *  Issue #342 - if not doctype 'auto', or 'html5'
                 *  then reset mode htm4-- parsing
                \*/
                TY_(AdjustTags)(doc); /* Dynamically modify the tags table to html4-- mode */
            }
        }
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
        break;
    }

    /* do this before any more document fixes */
    if ( cfg( doc, TidyAccessibilityCheckLevel ) > 0 )
        TY_(AccessibilityChecks)( doc );

    if (!TY_(FindHTML)(doc))
    {
        /* a later check should complain if <body> is empty */
        html = TY_(InferredTag)(doc, TidyTag_HTML);
        TY_(InsertNodeAtEnd)( &doc->root, html);
        ParseHTMLWithNode( doc, html );
    }

    node = TY_(FindTITLE)(doc);
    if (!node)
    {
        Node* head = TY_(FindHEAD)(doc);
        /* #72, avoid MISSING_TITLE_ELEMENT if show-body-only (but allow InsertNodeAtEnd to avoid new warning) */
        if (!showingBodyOnly(doc))
        {
            TY_(Report)(doc, head, NULL, MISSING_TITLE_ELEMENT);
        }
        TY_(InsertNodeAtEnd)(head, TY_(InferredTag)(doc, TidyTag_TITLE));
    }
    else if (!node->content && !showingBodyOnly(doc))
    {
        /* Is #839 - warn node is blank in HTML5 */
        if (TY_(IsHTML5Mode)(doc))
        {
            TY_(Report)(doc, node, NULL, BLANK_TITLE_ELEMENT);
        }
    }

    AttributeChecks(doc, &doc->root);
    ReplaceObsoleteElements(doc, &doc->root);
    TY_(DropEmptyElements)(doc, &doc->root);
    CleanSpaces(doc, &doc->root);

    if (cfgBool(doc, TidyEncloseBodyText))
        EncloseBodyText(doc);
    if (cfgBool(doc, TidyEncloseBlockText))
        EncloseBlockText(doc, &doc->root);
}